

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savestream.cpp
# Opt level: O0

void __thiscall signalInfo_t::addMetaInfo(signalInfo_t *this,string *method,Value *params)

{
  ostream *poVar1;
  FastWriter *this_00;
  size_t in_RCX;
  void *in_RDX;
  string *in_RSI;
  long in_RDI;
  FastWriter *in_stack_ffffffffffffff70;
  undefined1 local_68 [48];
  undefined1 local_38 [56];
  
  local_38._32_8_ = in_RDX;
  local_38._40_8_ = in_RSI;
  poVar1 = (ostream *)std::ostream::operator<<((void *)(in_RDI + 0x208),*(long *)(in_RDI + 0x200));
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)local_38._40_8_);
  poVar1 = std::operator<<(poVar1," ");
  Json::FastWriter::FastWriter(in_stack_ffffffffffffff70);
  Json::FastWriter::write_abi_cxx11_
            ((FastWriter *)local_38,(int)local_68,(void *)local_38._32_8_,in_RCX);
  this_00 = (FastWriter *)std::operator<<(poVar1,(string *)local_38);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_38);
  Json::FastWriter::~FastWriter(this_00);
  return;
}

Assistant:

void addMetaInfo(const std::string& method, const Json::Value& params)
	{
		metaInfoFile << dataFileNextLine << ": " << method << " " << Json::FastWriter().write(params) << std::endl;
	}